

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.hpp
# Opt level: O3

void __thiscall OpenMD::HydroIO::HydroIO(HydroIO *this)

{
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .level_stack_.stackTop_ = (char *)0x0;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .level_stack_.stackEnd_ = (char *)0x0;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .level_stack_.stack_ = (char *)0x0;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .os_ = (BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)0x0;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .level_stack_.allocator_ = (CrtAllocator *)0x0;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .level_stack_.initialCapacity_ = 0x200;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .maxDecimalPlaces_ = 0x144;
  *(undefined2 *)
   &(this->w_).
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .hasRoot_ = 0x2000;
  (this->w_).indentCharCount_ = 4;
  (this->w_).formatOptions_ = kFormatDefault;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&this->d_,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  return;
}

Assistant:

HydroIO() {}